

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

char * little2_skipS(ENCODING *enc,char *ptr)

{
  uint local_1c;
  byte *local_18;
  char *ptr_local;
  ENCODING *enc_local;
  
  local_18 = (byte *)ptr;
  while( true ) {
    if (local_18[1] == 0) {
      local_1c = (uint)*(byte *)((long)enc[1].scanners + (ulong)*local_18);
    }
    else {
      local_1c = unicode_byte_type(local_18[1],*local_18);
    }
    if ((1 < local_1c - 9) && (local_1c != 0x15)) break;
    local_18 = local_18 + 2;
  }
  return (char *)local_18;
}

Assistant:

PREFIX(skipS)(const ENCODING *enc, const char *ptr) {
  for (;;) {
    switch (BYTE_TYPE(enc, ptr)) {
    case BT_LF:
    case BT_CR:
    case BT_S:
      ptr += MINBPC(enc);
      break;
    default:
      return ptr;
    }
  }
}